

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int * nifti_get_intlist(int nvals,char *str)

{
  int iVar1;
  size_t sVar2;
  ushort **ppuVar3;
  ulong uVar4;
  bool bVar5;
  char *local_50;
  char *cpt;
  int nused;
  int istep;
  int itop;
  int ibot;
  int slen;
  int nout;
  int ipos;
  int ii;
  int *subv;
  char *str_local;
  uint *puStack_10;
  int nvals_local;
  
  _ipos = (uint *)0x0;
  if (nvals < 1) {
    puStack_10 = (uint *)0x0;
  }
  else if ((str == (char *)0x0) || (*str == '\0')) {
    puStack_10 = (uint *)0x0;
  }
  else {
    subv = (int *)str;
    str_local._4_4_ = nvals;
    _ipos = (uint *)malloc(8);
    if (_ipos == (uint *)0x0) {
      fprintf(_stderr,"** nifti_get_intlist: failed alloc of 2 ints\n");
      puStack_10 = (uint *)0x0;
    }
    else {
      ibot = 0;
      *_ipos = 0;
      slen = 0;
      if (((char)*subv == '[') || ((char)*subv == '{')) {
        slen = 1;
      }
      if (1 < g_opts.debug) {
        fprintf(_stderr,"-d making int_list (vals = %d) from \'%s\'\n",(ulong)str_local._4_4_,subv);
      }
      sVar2 = strlen((char *)subv);
      itop = (int)sVar2;
      while( true ) {
        bVar5 = false;
        if (slen < itop) {
          bVar5 = true;
          if ((*(char *)((long)subv + (long)slen) != ']') &&
             (bVar5 = true, *(char *)((long)subv + (long)slen) != '}')) {
            bVar5 = *(char *)((long)subv + (long)slen) == '\0';
          }
          bVar5 = (bool)(bVar5 ^ 1);
        }
        if (!bVar5) break;
        while (ppuVar3 = __ctype_b_loc(),
              ((*ppuVar3)[(int)*(char *)((long)subv + (long)slen)] & 0x2000) != 0) {
          slen = slen + 1;
        }
        if (((*(char *)((long)subv + (long)slen) == ']') ||
            (*(char *)((long)subv + (long)slen) == '}')) ||
           (*(char *)((long)subv + (long)slen) == '\0')) break;
        if (*(char *)((long)subv + (long)slen) == '$') {
          istep = str_local._4_4_ - 1;
          slen = slen + 1;
        }
        else {
          uVar4 = strtol((char *)((long)subv + (long)slen),&local_50,10);
          istep = (int)uVar4;
          if (istep < 0) {
            fprintf(_stderr,"** ERROR: list index %d is out of range 0..%d\n",uVar4 & 0xffffffff,
                    (ulong)(str_local._4_4_ - 1));
            free(_ipos);
            return (int *)0x0;
          }
          if ((int)str_local._4_4_ <= istep) {
            fprintf(_stderr,"** ERROR: list index %d is out of range 0..%d\n",uVar4 & 0xffffffff,
                    (ulong)(str_local._4_4_ - 1));
            free(_ipos);
            return (int *)0x0;
          }
          cpt._0_4_ = (int)local_50 - ((int)subv + slen);
          if ((istep == 0) && ((int)cpt == 0)) {
            fprintf(_stderr,"** ERROR: list syntax error \'%s\'\n",(long)subv + (long)slen);
            free(_ipos);
            return (int *)0x0;
          }
          slen = (int)cpt + slen;
        }
        while (ppuVar3 = __ctype_b_loc(),
              ((*ppuVar3)[(int)*(char *)((long)subv + (long)slen)] & 0x2000) != 0) {
          slen = slen + 1;
        }
        if (((*(char *)((long)subv + (long)slen) == ',') ||
            (*(char *)((long)subv + (long)slen) == ']')) ||
           ((*(char *)((long)subv + (long)slen) == '}' ||
            (*(char *)((long)subv + (long)slen) == '\0')))) {
          iVar1 = ibot + 2;
          ibot = ibot + 1;
          _ipos = (uint *)realloc(_ipos,(long)iVar1 << 2);
          if (_ipos == (uint *)0x0) {
            fprintf(_stderr,"** nifti_get_intlist: failed realloc of %d ints\n",(ulong)(ibot + 1));
            return (int *)0x0;
          }
          *_ipos = ibot;
          _ipos[ibot] = istep;
          if (((*(char *)((long)subv + (long)slen) == ']') ||
              (*(char *)((long)subv + (long)slen) == '}')) ||
             (*(char *)((long)subv + (long)slen) == '\0')) break;
          slen = slen + 1;
        }
        else {
          if (*(char *)((long)subv + (long)slen) == '-') {
            slen = slen + 1;
          }
          else {
            if ((*(char *)((long)subv + (long)slen) != '.') ||
               (*(char *)((long)subv + (long)(slen + 1)) != '.')) {
              fprintf(_stderr,"** ERROR: index list syntax is bad: \'%s\'\n",(long)subv + (long)slen
                     );
              free(_ipos);
              return (int *)0x0;
            }
            slen = slen + 2;
          }
          if (*(char *)((long)subv + (long)slen) == '$') {
            nused = str_local._4_4_ - 1;
            slen = slen + 1;
          }
          else {
            uVar4 = strtol((char *)((long)subv + (long)slen),&local_50,10);
            nused = (int)uVar4;
            if (nused < 0) {
              fprintf(_stderr,"** ERROR: index %d is out of range 0..%d\n",uVar4 & 0xffffffff,
                      (ulong)(str_local._4_4_ - 1));
              free(_ipos);
              return (int *)0x0;
            }
            if ((int)str_local._4_4_ <= nused) {
              fprintf(_stderr,"** ERROR: index %d is out of range 0..%d\n",uVar4 & 0xffffffff,
                      (ulong)(str_local._4_4_ - 1));
              free(_ipos);
              return (int *)0x0;
            }
            cpt._0_4_ = (int)local_50 - ((int)subv + slen);
            if ((nused == 0) && ((int)cpt == 0)) {
              fprintf(_stderr,"** ERROR: index list syntax error \'%s\'\n",(long)subv + (long)slen);
              free(_ipos);
              return (int *)0x0;
            }
            slen = (int)cpt + slen;
          }
          cpt._4_4_ = -1;
          if (istep <= nused) {
            cpt._4_4_ = 1;
          }
          while (ppuVar3 = __ctype_b_loc(),
                ((*ppuVar3)[(int)*(char *)((long)subv + (long)slen)] & 0x2000) != 0) {
            slen = slen + 1;
          }
          if (*(char *)((long)subv + (long)slen) == '(') {
            slen = slen + 1;
            uVar4 = strtol((char *)((long)subv + (long)slen),&local_50,10);
            cpt._4_4_ = (int)uVar4;
            if (cpt._4_4_ == 0) {
              fprintf(_stderr,"** ERROR: index loop step is 0!\n");
              free(_ipos);
              return (int *)0x0;
            }
            cpt._0_4_ = (int)local_50 - ((int)subv + slen);
            slen = (int)cpt + slen;
            if (*(char *)((long)subv + (long)slen) == ')') {
              slen = slen + 1;
            }
            if (0 < (istep - nused) * cpt._4_4_) {
              fprintf(_stderr,"** WARNING: index list \'%d..%d(%d)\' means nothing\n",
                      (ulong)(uint)istep,(ulong)(uint)nused,uVar4 & 0xffffffff);
            }
          }
          for (nout = istep; (nout - nused) * cpt._4_4_ < 1; nout = cpt._4_4_ + nout) {
            iVar1 = ibot + 2;
            ibot = ibot + 1;
            _ipos = (uint *)realloc(_ipos,(long)iVar1 << 2);
            if (_ipos == (uint *)0x0) {
              fprintf(_stderr,"** nifti_get_intlist: failed realloc of %d ints\n",(ulong)(ibot + 1))
              ;
              return (int *)0x0;
            }
            *_ipos = ibot;
            _ipos[ibot] = nout;
          }
          while (ppuVar3 = __ctype_b_loc(),
                ((*ppuVar3)[(int)*(char *)((long)subv + (long)slen)] & 0x2000) != 0) {
            slen = slen + 1;
          }
          if (*(char *)((long)subv + (long)slen) == ',') {
            slen = slen + 1;
          }
        }
      }
      if (1 < g_opts.debug) {
        fprintf(_stderr,"+d int_list (vals = %d): ",(ulong)*_ipos);
        for (nout = 1; nout <= (int)*_ipos; nout = nout + 1) {
          fprintf(_stderr,"%d ",(ulong)_ipos[nout]);
        }
        fputc(10,_stderr);
      }
      if (*_ipos == 0) {
        free(_ipos);
        _ipos = (uint *)0x0;
      }
      puStack_10 = _ipos;
    }
  }
  return (int *)puStack_10;
}

Assistant:

int * nifti_get_intlist( int nvals , const char * str )
{
   int *subv = NULL ;
   int ii , ipos , nout , slen ;
   int ibot,itop,istep , nused ;
   char *cpt ;

   /* Meaningless input? */
   if( nvals < 1 ) return NULL ;

   /* No selection list? */
   if( str == NULL || str[0] == '\0' ) return NULL ;

   /* skip initial '[' or '{' */
   subv = (int *)malloc( sizeof(int) * 2 ) ;
   if( !subv ) {
      fprintf(stderr,"** nifti_get_intlist: failed alloc of 2 ints\n");
      return NULL;
   }
   subv[0] = nout = 0 ;

   ipos = 0 ;
   if( str[ipos] == '[' || str[ipos] == '{' ) ipos++ ;

   if( g_opts.debug > 1 )
      fprintf(stderr,"-d making int_list (vals = %d) from '%s'\n", nvals, str);

   /**- for each sub-selector until end of input... */

   slen = (int)strlen(str) ;
   while( ipos < slen && !ISEND(str[ipos]) ){

     while( isspace((int) str[ipos]) ) ipos++ ;   /* skip blanks */
      if( ISEND(str[ipos]) ) break ;         /* done */

      /**- get starting value */

      if( str[ipos] == '$' ){  /* special case */
         ibot = nvals-1 ; ipos++ ;
      } else {                 /* decode an integer */
         ibot = strtol( str+ipos , &cpt , 10 ) ;
         if( ibot < 0 ){
           fprintf(stderr,"** ERROR: list index %d is out of range 0..%d\n",
                   ibot,nvals-1) ;
           free(subv) ; return NULL ;
         }
         if( ibot >= nvals ){
           fprintf(stderr,"** ERROR: list index %d is out of range 0..%d\n",
                   ibot,nvals-1) ;
           free(subv) ; return NULL ;
         }
         nused = (cpt-(str+ipos)) ;
         if( ibot == 0 && nused == 0 ){
           fprintf(stderr,"** ERROR: list syntax error '%s'\n",str+ipos) ;
           free(subv) ; return NULL ;
         }
         ipos += nused ;
      }

      while( isspace((int) str[ipos]) ) ipos++ ;   /* skip blanks */

      /**- if that's it for this sub-selector, add one value to list */

      if( str[ipos] == ',' || ISEND(str[ipos]) ){
         nout++ ;
         subv = (int *)realloc( (char *)subv , sizeof(int) * (nout+1) ) ;
         if( !subv ) {
            fprintf(stderr,"** nifti_get_intlist: failed realloc of %d ints\n",
                    nout+1);
            return NULL;
         }
         subv[0]    = nout ;
         subv[nout] = ibot ;
         if( ISEND(str[ipos]) ) break ; /* done */
         ipos++ ; continue ;            /* re-start loop at next sub-selector */
      }

      /**- otherwise, must have '..' or '-' as next inputs */

      if( str[ipos] == '-' ){
         ipos++ ;
      } else if( str[ipos] == '.' && str[ipos+1] == '.' ){
         ipos++ ; ipos++ ;
      } else {
         fprintf(stderr,"** ERROR: index list syntax is bad: '%s'\n",
                 str+ipos) ;
         free(subv) ; return NULL ;
      }

      /**- get ending value for loop now */

      if( str[ipos] == '$' ){  /* special case */
         itop = nvals-1 ; ipos++ ;
      } else {                 /* decode an integer */
         itop = strtol( str+ipos , &cpt , 10 ) ;
         if( itop < 0 ){
           fprintf(stderr,"** ERROR: index %d is out of range 0..%d\n",
                   itop,nvals-1) ;
           free(subv) ; return NULL ;
         }
         if( itop >= nvals ){
           fprintf(stderr,"** ERROR: index %d is out of range 0..%d\n",
                   itop,nvals-1) ;
           free(subv) ; return NULL ;
         }
         nused = (cpt-(str+ipos)) ;
         if( itop == 0 && nused == 0 ){
           fprintf(stderr,"** ERROR: index list syntax error '%s'\n",str+ipos) ;
           free(subv) ; return NULL ;
         }
         ipos += nused ;
      }

      /**- set default loop step */

      istep = (ibot <= itop) ? 1 : -1 ;

      while( isspace((int) str[ipos]) ) ipos++ ;            /* skip blanks */

      /**- check if we have a non-default loop step */

      if( str[ipos] == '(' ){  /* decode an integer */
         ipos++ ;
         istep = strtol( str+ipos , &cpt , 10 ) ;
         if( istep == 0 ){
           fprintf(stderr,"** ERROR: index loop step is 0!\n") ;
           free(subv) ; return NULL ;
         }
         nused = (cpt-(str+ipos)) ;
         ipos += nused ;
         if( str[ipos] == ')' ) ipos++ ;
         if( (ibot-itop)*istep > 0 ){
           fprintf(stderr,"** WARNING: index list '%d..%d(%d)' means nothing\n",
                   ibot,itop,istep ) ;
         }
      }

      /**- add values to output */

      for( ii=ibot ; (ii-itop)*istep <= 0 ; ii += istep ){
         nout++ ;
         subv = (int *)realloc( (char *)subv , sizeof(int) * (nout+1) ) ;
         if( !subv ) {
            fprintf(stderr,"** nifti_get_intlist: failed realloc of %d ints\n",
                    nout+1);
            return NULL;
         }
         subv[0]    = nout ;
         subv[nout] = ii ;
      }

      /**- check if we have a comma to skip over */

      while( isspace((int) str[ipos]) ) ipos++ ;            /* skip blanks */
      if( str[ipos] == ',' ) ipos++ ;                       /* skip commas */

   }  /* end of loop through selector string */

   if( g_opts.debug > 1 ) {
      fprintf(stderr,"+d int_list (vals = %d): ", subv[0]);
      for( ii = 1; ii <= subv[0]; ii++ ) fprintf(stderr,"%d ", subv[ii]);
      fputc('\n',stderr);
   }

   if( subv[0] == 0 ){ free(subv); subv = NULL; }
   return subv ;
}